

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O0

void __thiscall
hdc::SymbolTableBuilderVisitor::visit(SymbolTableBuilderVisitor *this,AtExpression *expression)

{
  int iVar1;
  IdentifierExpression *this_00;
  Symbol *value;
  Type *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 local_80 [56];
  Variable *v;
  string name;
  IdentifierExpression *id;
  Symbol *symbol;
  AtExpression *expression_local;
  SymbolTableBuilderVisitor *this_local;
  
  std::__cxx11::string::string((string *)&v);
  this_00 = (IdentifierExpression *)UnaryOperator::getExpression(&expression->super_UnaryOperator);
  IdentifierExpression::getName_abi_cxx11_((IdentifierExpression *)local_80);
  std::__cxx11::string::operator=((string *)&v,(string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  value = SymbolTable::hasClassVariable(this->symbolTable,(string *)&v);
  if (value != (Symbol *)0x0) {
    IdentifierExpression::setSymbol(this_00,value);
    pTVar2 = Symbol::getType(value);
    iVar1 = (*(pTVar2->super_ASTNode)._vptr_ASTNode[3])();
    Expression::setType((Expression *)this_00,(Type *)CONCAT44(extraout_var,iVar1));
    pTVar2 = Expression::getType((Expression *)this_00);
    setLastType(this,pTVar2);
  }
  iVar1 = (*(this->lastType->super_ASTNode)._vptr_ASTNode[3])();
  Expression::setType((Expression *)expression,(Type *)CONCAT44(extraout_var_00,iVar1));
  std::__cxx11::string::~string((string *)&v);
  return;
}

Assistant:

void SymbolTableBuilderVisitor::visit(AtExpression* expression) {
    Symbol* symbol;
    IdentifierExpression* id;
    std::string name;
    Variable* v;

    id = (IdentifierExpression*) expression->getExpression();
    name = id->getName();
    symbol = symbolTable->hasClassVariable(name);

    if (symbol != nullptr) {
        id->setSymbol(symbol);
        id->setType(symbol->getType()->clone());
        setLastType(id->getType());
    }

    expression->setType(lastType->clone());
}